

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.cpp
# Opt level: O3

void __thiscall DeflateEncoder::run(DeflateEncoder *this)

{
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_00;
  pointer pcVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Lz77Encoder lz77;
  HuffmanEncoder huffman;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  long *local_170;
  long local_168;
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  Cryptor local_130;
  HuffmanEncoder local_e0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Deflate encryption...",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  pcVar1 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + (this->super_Cryptor).in_message_._M_string_length
            );
  psVar2 = &local_e0.super_Cryptor.in_message_._M_string_length;
  local_e0.super_Cryptor._vptr_Cryptor = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_190,local_190->_M_local_buf + local_188);
  local_130.in_message_._M_dataplus._M_p = (pointer)&local_130.in_message_.field_2;
  if (local_e0.super_Cryptor._vptr_Cryptor == (_func_int **)psVar2) {
    local_130.in_message_.field_2._8_8_ =
         local_e0.super_Cryptor.in_message_.field_2._M_allocated_capacity;
  }
  else {
    local_130.in_message_._M_dataplus._M_p = (pointer)local_e0.super_Cryptor._vptr_Cryptor;
  }
  local_130.out_message_._M_dataplus._M_p = (pointer)&local_130.out_message_.field_2;
  local_130.in_message_._M_string_length =
       (size_type)local_e0.super_Cryptor.in_message_._M_dataplus._M_p;
  local_130.out_message_._M_string_length = 0;
  local_130.out_message_.field_2._M_local_buf[0] = '\0';
  local_130._vptr_Cryptor = (_func_int **)&PTR__Cryptor_0010fcf8;
  local_130.show_ = true;
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180._M_allocated_capacity + 1);
  }
  Lz77Encoder::run((Lz77Encoder *)&local_130);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_130.out_message_._M_dataplus._M_p,
             local_130.out_message_._M_dataplus._M_p + local_130.out_message_._M_string_length);
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_170,local_168 + (long)local_170);
  local_e0.super_Cryptor.in_message_._M_dataplus._M_p =
       (pointer)&local_e0.super_Cryptor.in_message_.field_2;
  if (local_190 == &local_180) {
    local_e0.super_Cryptor.in_message_.field_2._8_8_ = local_180._8_8_;
  }
  else {
    local_e0.super_Cryptor.in_message_._M_dataplus._M_p = (pointer)local_190;
  }
  local_e0.super_Cryptor.out_message_._M_dataplus._M_p =
       (pointer)&local_e0.super_Cryptor.out_message_.field_2;
  local_e0.super_Cryptor.in_message_._M_string_length = local_188;
  local_e0.super_Cryptor.out_message_._M_string_length = 0;
  local_e0.super_Cryptor.out_message_.field_2._M_local_buf[0] = '\0';
  local_e0.super_Cryptor._vptr_Cryptor = (_func_int **)&PTR__HuffmanEncoder_0010fb60;
  this_00 = &local_e0.nodes_;
  local_e0.nodes_.
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node._M_size = 0;
  paVar3 = &local_e0.temp_code_.field_2;
  local_e0.temp_code_._M_string_length = 0;
  local_e0.temp_code_.field_2._M_local_buf[0] = '\0';
  local_e0.table_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_e0.table_._M_t._M_impl + 8);
  local_e0.table_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0.table_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0.table_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0.super_Cryptor.show_ = true;
  local_e0.nodes_.
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  local_e0.nodes_.
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  local_e0.temp_code_._M_dataplus._M_p = (pointer)paVar3;
  local_e0.table_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0.table_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  HuffmanEncoder::run(&local_e0);
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,local_e0.super_Cryptor.out_message_._M_dataplus._M_p,
             local_e0.super_Cryptor.out_message_._M_dataplus._M_p +
             local_e0.super_Cryptor.out_message_._M_string_length);
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,(string *)local_150)
  ;
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"encryption done",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::
  _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e0.table_._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.temp_code_._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.temp_code_._M_dataplus._M_p,
                    CONCAT71(local_e0.temp_code_.field_2._M_allocated_capacity._1_7_,
                             local_e0.temp_code_.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::_M_clear
            (&this_00->
              super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
            );
  Cryptor::~Cryptor(&local_e0.super_Cryptor);
  Cryptor::~Cryptor(&local_130);
  return;
}

Assistant:

void DeflateEncoder::run() {
  cout << "Deflate encryption..." << endl;

  Lz77Encoder lz77(get_in_message());
  lz77.run();
  HuffmanEncoder huffman(lz77.get_out_message());
  huffman.run();
  set_out_message(huffman.get_out_message());

  cout << "encryption done" << endl;
}